

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void header(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Welcome to the best chat ever!");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Type \'exit\' to quit.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"Username must");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," - be 3 min length");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," - be 14 max length");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," - contain only alphanumericals caracters.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void header()
{
    std::cout << "Welcome to the best chat ever!" << std::endl;
    std::cout << "Type '" EXIT_KEYWORD "' to quit." << std::endl;
    std::cout << std::endl;
    std::cout << "Username must" << std::endl;
    std::cout << " - be 3 min length" << std::endl;
    std::cout << " - be 14 max length" << std::endl;
    std::cout << " - contain only alphanumericals caracters." << std::endl;
    std::cout << std::endl;
}